

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_output_model(options_i *options,vw *all)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  long in_RSI;
  option_group_definition *in_RDI;
  option_group_definition output_model_options;
  undefined7 in_stack_fffffffffffff568;
  undefined1 in_stack_fffffffffffff56f;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff570;
  string *in_stack_fffffffffffff578;
  allocator *paVar4;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff5b8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  option_group_definition *in_stack_fffffffffffff5c0;
  option_group_definition *this;
  allocator local_939;
  string local_938 [39];
  allocator local_911;
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [199];
  undefined1 local_821 [40];
  undefined1 local_7f9 [200];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [199];
  allocator local_641;
  string local_640 [39];
  allocator local_619;
  string local_618 [199];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [199];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [199];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [199];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [199];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [215];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [56];
  long local_10;
  option_group_definition *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Output model",&local_69);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff570,
             (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"final_regressor",&local_141);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"f",&local_169);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  short_name(in_stack_fffffffffffff570,
             (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Final regressor",&local_191);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff570,
       (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"readable_model",&local_259);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"Output human-readable final regressor with numeric features",&local_281);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff570,
       (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"invert_hash",&local_349);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_370,
             "Output human-readable final regressor with feature names.  Computationally expensive."
             ,&local_371);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff570,
       (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"save_resume",&local_439);
  VW::config::make_option<bool>(in_stack_fffffffffffff578,(bool *)in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_460,"save extra state so learning can be resumed later with new data",&local_461)
  ;
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff570,
             (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff5c0,(typed_option<bool> *)in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"preserve_performance_counters",&local_529);
  VW::config::make_option<bool>(in_stack_fffffffffffff578,(bool *)in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"reset performance counters when warmstarting",&local_551);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff570,
             (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff5c0,(typed_option<bool> *)in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"save_per_pass",&local_619);
  VW::config::make_option<bool>(in_stack_fffffffffffff578,(bool *)in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"Save the model after every pass over data",&local_641);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff570,
             (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff5c0,(typed_option<bool> *)in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"output_feature_regularizer_binary",&local_709);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"Per feature regularization output file",&local_731);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff570,
       (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  this = (option_group_definition *)local_7f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_7f9 + 1),"output_feature_regularizer_text",(allocator *)this);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff570);
  op = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_821;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_821 + 1),"Per feature regularization output file, in text",
             (allocator *)op);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff570,
       (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>(this,op)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"id",&local_8e9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff578,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_910,"User supplied ID embedded into the final regressor",&local_911);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff570,
       (string *)CONCAT17(in_stack_fffffffffffff56f,in_stack_fffffffffffff568));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>(this,op)
  ;
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string((string *)(local_821 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_821);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff570);
  std::__cxx11::string::~string((string *)(local_7f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_7f9);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff570);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  (*(code *)**(undefined8 **)&local_8->m_name)(local_8,local_48);
  iVar2 = std::__cxx11::string::compare((char *)(local_10 + 0x3570));
  if ((iVar2 != 0) && ((*(byte *)(local_10 + 0x3439) & 1) == 0)) {
    poVar3 = std::operator<<((ostream *)(local_10 + 0xe0),"final_regressor = ");
    poVar3 = std::operator<<(poVar3,(string *)(local_10 + 0x3570));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  paVar4 = &local_939;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"invert_hash",paVar4);
  bVar1 = (**(code **)(*(long *)&local_8->m_name + 8))(local_8,local_938);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  if ((bVar1 & 1) != 0) {
    *(undefined1 *)(local_10 + 0x3618) = 1;
  }
  VW::config::option_group_definition::~option_group_definition(local_8);
  return;
}

Assistant:

void parse_output_model(options_i& options, vw& all)
{
  option_group_definition output_model_options("Output model");
  output_model_options
      .add(make_option("final_regressor", all.final_regressor_name).short_name("f").help("Final regressor"))
      .add(make_option("readable_model", all.text_regressor_name)
               .help("Output human-readable final regressor with numeric features"))
      .add(make_option("invert_hash", all.inv_hash_regressor_name)
               .help("Output human-readable final regressor with feature names.  Computationally expensive."))
      .add(make_option("save_resume", all.save_resume)
               .help("save extra state so learning can be resumed later with new data"))
      .add(make_option("preserve_performance_counters", all.preserve_performance_counters)
               .help("reset performance counters when warmstarting"))
      .add(make_option("save_per_pass", all.save_per_pass).help("Save the model after every pass over data"))
      .add(make_option("output_feature_regularizer_binary", all.per_feature_regularizer_output)
               .help("Per feature regularization output file"))
      .add(make_option("output_feature_regularizer_text", all.per_feature_regularizer_text)
               .help("Per feature regularization output file, in text"))
      .add(make_option("id", all.id).help("User supplied ID embedded into the final regressor"));
  options.add_and_parse(output_model_options);

  if (all.final_regressor_name.compare("") && !all.quiet)
    all.trace_message << "final_regressor = " << all.final_regressor_name << endl;

  if (options.was_supplied("invert_hash"))
    all.hash_inv = true;

  // Question: This doesn't seem necessary
  // if (options.was_supplied("id") && find(arg.args.begin(), arg.args.end(), "--id") == arg.args.end())
  // {
  //   arg.args.push_back("--id");
  //   arg.args.push_back(arg.vm["id"].as<string>());
  // }
}